

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

xmlParserInputPtr resolveEntityDebug(void *ctx,xmlChar *publicId,xmlChar *systemId)

{
  xmlChar *systemId_local;
  xmlChar *publicId_local;
  void *ctx_local;
  
  callbacks = callbacks + 1;
  if (quiet == 0) {
    fprintf((FILE *)SAXdebug,"SAX.resolveEntity(");
    if (publicId == (xmlChar *)0x0) {
      fprintf((FILE *)SAXdebug," ");
    }
    else {
      fprintf((FILE *)SAXdebug,"%s",publicId);
    }
    if (systemId == (xmlChar *)0x0) {
      fprintf((FILE *)SAXdebug,", )\n");
    }
    else {
      fprintf((FILE *)SAXdebug,", %s)\n",systemId);
    }
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

static xmlParserInputPtr
resolveEntityDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *publicId, const xmlChar *systemId)
{
    callbacks++;
    if (quiet)
	return(NULL);
    /* xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx; */


    fprintf(SAXdebug, "SAX.resolveEntity(");
    if (publicId != NULL)
	fprintf(SAXdebug, "%s", (char *)publicId);
    else
	fprintf(SAXdebug, " ");
    if (systemId != NULL)
	fprintf(SAXdebug, ", %s)\n", (char *)systemId);
    else
	fprintf(SAXdebug, ", )\n");
/*********
    if (systemId != NULL) {
        return(xmlNewInputFromFile(ctxt, (char *) systemId));
    }
 *********/
    return(NULL);
}